

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfd-test.c
# Opt level: O0

atf_error_t microatf_tp_add_tcs(atf_tp_t *tp)

{
  ulong uVar1;
  atf_error_t ec_18;
  atf_error_t ec_17;
  atf_error_t ec_16;
  atf_error_t ec_15;
  atf_error_t ec_14;
  atf_error_t ec_13;
  atf_error_t ec_12;
  atf_error_t ec_11;
  atf_error_t ec_10;
  atf_error_t ec_9;
  atf_error_t ec_8;
  atf_error_t ec_7;
  atf_error_t ec_6;
  atf_error_t ec_5;
  atf_error_t ec_4;
  atf_error_t ec_3;
  atf_error_t ec_2;
  atf_error_t ec_1;
  atf_error_t ec;
  atf_tp_t *tp_local;
  
  tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd__many_timers);
  uVar1 = atf_is_error(tp_local);
  if ((uVar1 & 1) == 0) {
    tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd__simple_timer);
    uVar1 = atf_is_error(tp_local);
    if ((uVar1 & 1) == 0) {
      tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd__simple_periodic_timer);
      uVar1 = atf_is_error(tp_local);
      if ((uVar1 & 1) == 0) {
        tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd__complex_periodic_timer);
        uVar1 = atf_is_error(tp_local);
        if ((uVar1 & 1) == 0) {
          tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd__reset_periodic_timer);
          uVar1 = atf_is_error(tp_local);
          if ((uVar1 & 1) == 0) {
            tp_local = (atf_tp_t *)
                       microatf_tp_add_tc(tp,&microatf_tc_timerfd__reenable_periodic_timer);
            uVar1 = atf_is_error(tp_local);
            if ((uVar1 & 1) == 0) {
              tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd__expire_five);
              uVar1 = atf_is_error(tp_local);
              if ((uVar1 & 1) == 0) {
                tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd__simple_gettime);
                uVar1 = atf_is_error(tp_local);
                if ((uVar1 & 1) == 0) {
                  tp_local = (atf_tp_t *)
                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__simple_blocking_periodic_timer
                                               );
                  uVar1 = atf_is_error(tp_local);
                  if ((uVar1 & 1) == 0) {
                    tp_local = (atf_tp_t *)
                               microatf_tp_add_tc(tp,&microatf_tc_timerfd__argument_checks);
                    uVar1 = atf_is_error(tp_local);
                    if ((uVar1 & 1) == 0) {
                      tp_local = (atf_tp_t *)
                                 microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__upgrade_simple_to_complex);
                      uVar1 = atf_is_error(tp_local);
                      if ((uVar1 & 1) == 0) {
                        tp_local = (atf_tp_t *)
                                   microatf_tp_add_tc(tp,&microatf_tc_timerfd__absolute_timer);
                        uVar1 = atf_is_error(tp_local);
                        if ((uVar1 & 1) == 0) {
                          tp_local = (atf_tp_t *)
                                     microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__absolute_timer_in_the_past);
                          uVar1 = atf_is_error(tp_local);
                          if ((uVar1 & 1) == 0) {
                            tp_local = (atf_tp_t *)
                                       microatf_tp_add_tc(tp,&microatf_tc_timerfd__reset_absolute);
                            uVar1 = atf_is_error(tp_local);
                            if ((uVar1 & 1) == 0) {
                              tp_local = (atf_tp_t *)
                                         microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__periodic_timer_performance);
                              uVar1 = atf_is_error(tp_local);
                              if ((uVar1 & 1) == 0) {
                                tp_local = (atf_tp_t *)
                                           microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__argument_overflow);
                                uVar1 = atf_is_error(tp_local);
                                if ((uVar1 & 1) == 0) {
                                  tp_local = (atf_tp_t *)
                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__short_evfilt_timer_timeout);
                                  uVar1 = atf_is_error(tp_local);
                                  if ((uVar1 & 1) == 0) {
                                    tp_local = (atf_tp_t *)
                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__unmodified_errno);
                                    uVar1 = atf_is_error(tp_local);
                                    if ((uVar1 & 1) == 0) {
                                      tp_local = (atf_tp_t *)
                                                 microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__reset_to_very_long);
                                      uVar1 = atf_is_error(tp_local);
                                      if ((uVar1 & 1) == 0) {
                                        tp_local = (atf_tp_t *)atf_no_error();
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (atf_error_t)tp_local;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, timerfd__many_timers);
	ATF_TP_ADD_TC(tp, timerfd__simple_timer);
	ATF_TP_ADD_TC(tp, timerfd__simple_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__complex_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__reset_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__reenable_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__expire_five);
	ATF_TP_ADD_TC(tp, timerfd__simple_gettime);
	ATF_TP_ADD_TC(tp, timerfd__simple_blocking_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__argument_checks);
	ATF_TP_ADD_TC(tp, timerfd__upgrade_simple_to_complex);
	ATF_TP_ADD_TC(tp, timerfd__absolute_timer);
	ATF_TP_ADD_TC(tp, timerfd__absolute_timer_in_the_past);
	ATF_TP_ADD_TC(tp, timerfd__reset_absolute);
	ATF_TP_ADD_TC(tp, timerfd__periodic_timer_performance);
	ATF_TP_ADD_TC(tp, timerfd__argument_overflow);
	ATF_TP_ADD_TC(tp, timerfd__short_evfilt_timer_timeout);
	ATF_TP_ADD_TC(tp, timerfd__unmodified_errno);
	ATF_TP_ADD_TC(tp, timerfd__reset_to_very_long);

	return atf_no_error();
}